

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O3

double __thiscall chaiscript::Boxed_Number::get_as<double>(Boxed_Number *this)

{
  undefined8 uVar1;
  Common_Types CVar2;
  uint uVar3;
  undefined8 *puVar4;
  double dVar5;
  
  CVar2 = get_common_type(&this->bv);
  switch(CVar2) {
  case t_int32:
    dVar5 = (double)*((this->bv).m_data.
                      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->m_const_data_ptr;
    break;
  case t_double:
    dVar5 = *((this->bv).m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->m_const_data_ptr;
    break;
  case t_uint8:
    uVar3 = (uint)*((this->bv).m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->m_const_data_ptr;
    goto LAB_002a206d;
  case t_int8:
    uVar3 = (uint)*((this->bv).m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->m_const_data_ptr;
    goto LAB_002a206d;
  case t_uint16:
    uVar3 = (uint)*((this->bv).m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->m_const_data_ptr;
    goto LAB_002a206d;
  case t_int16:
    uVar3 = (uint)*((this->bv).m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->m_const_data_ptr;
LAB_002a206d:
    dVar5 = (double)(int)uVar3;
    break;
  case t_uint32:
    dVar5 = (double)*((this->bv).m_data.
                      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->m_const_data_ptr;
    break;
  case t_uint64:
    uVar1 = *((this->bv).m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->m_const_data_ptr;
    dVar5 = ((double)CONCAT44(0x45300000,(int)((ulong)uVar1 >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
    break;
  case t_int64:
    dVar5 = (double)*((this->bv).m_data.
                      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->m_const_data_ptr;
    break;
  case t_float:
    dVar5 = (double)*((this->bv).m_data.
                      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->m_const_data_ptr;
    break;
  case t_long_double:
    dVar5 = (double)*((this->bv).m_data.
                      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->m_const_data_ptr;
    break;
  default:
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = &PTR__bad_cast_003c4d80;
    __cxa_throw(puVar4,&detail::exception::bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
  }
  return dVar5;
}

Assistant:

Target get_as() const {
      switch (get_common_type(bv)) {
        case Common_Types::t_int32:
          return get_as_aux<Target, int32_t>(bv);
        case Common_Types::t_uint8:
          return get_as_aux<Target, uint8_t>(bv);
        case Common_Types::t_int8:
          return get_as_aux<Target, int8_t>(bv);
        case Common_Types::t_uint16:
          return get_as_aux<Target, uint16_t>(bv);
        case Common_Types::t_int16:
          return get_as_aux<Target, int16_t>(bv);
        case Common_Types::t_uint32:
          return get_as_aux<Target, uint32_t>(bv);
        case Common_Types::t_uint64:
          return get_as_aux<Target, uint64_t>(bv);
        case Common_Types::t_int64:
          return get_as_aux<Target, int64_t>(bv);
        case Common_Types::t_double:
          return get_as_aux<Target, double>(bv);
        case Common_Types::t_float:
          return get_as_aux<Target, float>(bv);
        case Common_Types::t_long_double:
          return get_as_aux<Target, long double>(bv);
      }

      throw chaiscript::detail::exception::bad_any_cast();
    }